

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::fixOffset(TParseContext *this,TSourceLoc *loc,TSymbol *symbol)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  TQualifier *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  undefined4 extraout_var_02;
  ulong uVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TArraySizes *this_01;
  undefined4 extraout_var_05;
  int local_30;
  int repeated;
  int numOffsets;
  int offset;
  TQualifier *qualifier;
  TSymbol *symbol_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  iVar2 = (*symbol->_vptr_TSymbol[0xc])();
  this_00 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x58))();
  iVar2 = (*symbol->_vptr_TSymbol[0xc])();
  bVar1 = TType::isAtomic((TType *)CONCAT44(extraout_var_00,iVar2));
  if (!bVar1) {
    return;
  }
  bVar1 = TQualifier::hasBinding(this_00);
  if (!bVar1) {
    return;
  }
  if ((this->resources).maxAtomicCounterBindings <=
      (int)((uint)((ulong)*(undefined8 *)&this_00->field_0x1c >> 0x20) & 0xffff)) {
    return;
  }
  bVar1 = TQualifier::hasOffset(this_00);
  if (bVar1) {
    repeated = this_00->layoutOffset;
  }
  else {
    repeated = this->atomicUintOffsets
               [(uint)((ulong)*(undefined8 *)&this_00->field_0x1c >> 0x20) & 0xffff];
  }
  if (repeated % 4 != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"atomic counters offset should align based on 4:","offset","%d",
               (ulong)(uint)repeated);
  }
  iVar2 = (*symbol->_vptr_TSymbol[0xd])();
  lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x50))();
  *(int *)(lVar4 + 0x14) = repeated;
  local_30 = 4;
  iVar2 = (*symbol->_vptr_TSymbol[0xc])();
  uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0xe8))();
  if ((uVar5 & 1) != 0) {
    iVar2 = (*symbol->_vptr_TSymbol[0xc])();
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0xf0))();
    if ((uVar5 & 1) != 0) {
      iVar2 = (*symbol->_vptr_TSymbol[0xc])();
      this_01 = (TArraySizes *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x98))();
      bVar1 = TArraySizes::isInnerUnsized(this_01);
      if (!bVar1) {
        iVar2 = (*symbol->_vptr_TSymbol[0xc])();
        local_30 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar2) + 0x88))();
        local_30 = local_30 * 4;
        goto LAB_0076fcad;
      }
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"array must be explicitly sized","atomic_uint","");
  }
LAB_0076fcad:
  uVar3 = TIntermediate::addUsedOffsets
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                     (uint)((ulong)*(undefined8 *)&this_00->field_0x1c >> 0x20) & 0xffff,repeated,
                     local_30);
  if (-1 < (int)uVar3) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"atomic counters sharing the same offset:","offset","%d",(ulong)uVar3);
  }
  this->atomicUintOffsets[(uint)((ulong)*(undefined8 *)&this_00->field_0x1c >> 0x20) & 0xffff] =
       repeated + local_30;
  return;
}

Assistant:

void TParseContext::fixOffset(const TSourceLoc& loc, TSymbol& symbol)
{
    const TQualifier& qualifier = symbol.getType().getQualifier();
    if (symbol.getType().isAtomic()) {
        if (qualifier.hasBinding() && (int)qualifier.layoutBinding < resources.maxAtomicCounterBindings) {

            // Set the offset
            int offset;
            if (qualifier.hasOffset())
                offset = qualifier.layoutOffset;
            else
                offset = atomicUintOffsets[qualifier.layoutBinding];

            if (offset % 4 != 0)
                error(loc, "atomic counters offset should align based on 4:", "offset", "%d", offset);

            symbol.getWritableType().getQualifier().layoutOffset = offset;

            // Check for overlap
            int numOffsets = 4;
            if (symbol.getType().isArray()) {
                if (symbol.getType().isSizedArray() && !symbol.getType().getArraySizes()->isInnerUnsized())
                    numOffsets *= symbol.getType().getCumulativeArraySize();
                else {
                    // "It is a compile-time error to declare an unsized array of atomic_uint."
                    error(loc, "array must be explicitly sized", "atomic_uint", "");
                }
            }
            int repeated = intermediate.addUsedOffsets(qualifier.layoutBinding, offset, numOffsets);
            if (repeated >= 0)
                error(loc, "atomic counters sharing the same offset:", "offset", "%d", repeated);

            // Bump the default offset
            atomicUintOffsets[qualifier.layoutBinding] = offset + numOffsets;
        }
    }
}